

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_custom_notification.cxx
# Opt level: O0

ptr<buffer> __thiscall nuraft::out_of_log_msg::serialize(out_of_log_msg *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<buffer> *in_RSI;
  buffer_serializer *in_RDI;
  ptr<buffer> pVar1;
  buffer_serializer bs;
  uint8_t CURRENT_VERSION;
  size_t len;
  ptr<buffer> *ret;
  size_t in_stack_000000e8;
  buffer_serializer *this_00;
  undefined7 in_stack_ffffffffffffffb8;
  uint8_t in_stack_ffffffffffffffbf;
  buffer_serializer *in_stack_ffffffffffffffc0;
  
  this_00 = in_RDI;
  buffer::alloc(in_stack_000000e8);
  buffer_serializer::buffer_serializer(this_00,in_RSI,(endianness)((ulong)in_RDI >> 0x20));
  buffer_serializer::put_u8(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbf);
  buffer_serializer::put_u64
            (in_stack_ffffffffffffffc0,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8)
            );
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (ptr<buffer>)pVar1.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<buffer> out_of_log_msg::serialize() const {
    //   << Format >>
    // version                      1 byte
    // start log index of leader    8 bytes
    size_t len = sizeof(uint8_t) + sizeof(ulong);
    ptr<buffer> ret = buffer::alloc(len);

    const uint8_t CURRENT_VERSION = 0x0;
    buffer_serializer bs(ret);
    bs.put_u8(CURRENT_VERSION);
    bs.put_u64(start_idx_of_leader_);
    return ret;
}